

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComplexTypeInfo.hpp
# Opt level: O3

void __thiscall
xercesc_4_0::ComplexTypeInfo::addElement(ComplexTypeInfo *this,SchemaElementDecl *elem)

{
  ulong uVar1;
  MemoryManager *pMVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  int iVar5;
  XMLSize_t index;
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *this_00;
  undefined4 extraout_var;
  long lVar6;
  ulong uVar7;
  
  this_00 = &this->fElements->super_BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>;
  if (this_00 == (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)0x0) {
    this_00 = (BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)
              XMemory::operator_new(0x30,this->fMemoryManager);
    pMVar2 = this->fMemoryManager;
    ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&this_00->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__BaseRefVectorOf_00409870;
    this_00->fAdoptedElems = false;
    this_00->fCurCount = 0;
    this_00->fMaxCount = 8;
    this_00->fElemList = (SchemaElementDecl **)0x0;
    this_00->fMemoryManager = pMVar2;
    iVar5 = (*pMVar2->_vptr_MemoryManager[3])(pMVar2,0x40);
    this_00->fElemList = (SchemaElementDecl **)CONCAT44(extraout_var,iVar5);
    lVar6 = 0;
    do {
      this_00->fElemList[lVar6] = (SchemaElementDecl *)0x0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    ((BaseRefVectorOf<xercesc_4_0::SchemaElementDecl> *)&this_00->_vptr_BaseRefVectorOf)->
    _vptr_BaseRefVectorOf = (_func_int **)&PTR__RefVectorOf_004097f8;
    this->fElements = (RefVectorOf<xercesc_4_0::SchemaElementDecl> *)this_00;
  }
  else {
    uVar1 = this_00->fCurCount;
    if (uVar1 != 0) {
      if (*this_00->fElemList == elem) {
        return;
      }
      uVar4 = 1;
      do {
        uVar7 = uVar4;
        if (uVar1 == uVar7) break;
        uVar4 = uVar7 + 1;
      } while (this_00->fElemList[uVar7] != elem);
      if (uVar7 < uVar1) {
        return;
      }
    }
  }
  BaseRefVectorOf<xercesc_4_0::SchemaElementDecl>::ensureExtraCapacity(this_00,1);
  XVar3 = this_00->fCurCount;
  this_00->fElemList[XVar3] = elem;
  this_00->fCurCount = XVar3 + 1;
  return;
}

Assistant:

inline void ComplexTypeInfo::addElement(SchemaElementDecl* const elem) {

    if (!fElements) {
        fElements = new (fMemoryManager) RefVectorOf<SchemaElementDecl>(8, false, fMemoryManager);
    }
    else if (fElements->containsElement(elem)) {
        return;
    }

    fElements->addElement(elem);
}